

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::CPPerror(TPpContext *this,TPpToken *ppToken)

{
  int iVar1;
  string message;
  TSourceLoc loc;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined4 local_48;
  undefined4 uStack_44;
  int iStack_40;
  uint uStack_3c;
  undefined8 local_38;
  
  this->disableEscapeSequences = true;
  iVar1 = scanToken(this,ppToken);
  this->disableEscapeSequences = false;
  local_60 = 0;
  local_58 = 0;
  local_38 = *(undefined8 *)&(ppToken->loc).column;
  local_48 = *(undefined4 *)&(ppToken->loc).name;
  uStack_44 = *(undefined4 *)((long)&(ppToken->loc).name + 4);
  iStack_40 = (ppToken->loc).string;
  uStack_3c = (ppToken->loc).line;
  local_68 = &local_58;
  while ((iVar1 - 0x98U < 9 || ((iVar1 != -1 && (iVar1 != 10))))) {
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::append((char *)&local_68);
    iVar1 = scanToken(this,ppToken);
  }
  (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3d])
            (this->parseContext,(ulong)uStack_3c,local_68);
  (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
            (this->parseContext,&local_48,local_68,"#error","");
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return 10;
}

Assistant:

int TPpContext::CPPerror(TPpToken* ppToken)
{
    disableEscapeSequences = true;
    int token = scanToken(ppToken);
    disableEscapeSequences = false;
    std::string message;
    TSourceLoc loc = ppToken->loc;

    while (token != '\n' && token != EndOfInput) {
        if (token == PpAtomConstInt16 || token == PpAtomConstUint16 ||
            token == PpAtomConstInt   || token == PpAtomConstUint   ||
            token == PpAtomConstInt64 || token == PpAtomConstUint64 ||
            token == PpAtomConstFloat16 ||
            token == PpAtomConstFloat || token == PpAtomConstDouble) {
                message.append(ppToken->name);
        } else if (token == PpAtomIdentifier || token == PpAtomConstString) {
            message.append(ppToken->name);
        } else {
            message.append(atomStrings.getString(token));
        }
        message.append(" ");
        token = scanToken(ppToken);
    }
    parseContext.notifyErrorDirective(loc.line, message.c_str());
    // store this msg into the shader's information log..set the Compile Error flag!!!!
    parseContext.ppError(loc, message.c_str(), "#error", "");

    return '\n';
}